

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort_TEST.cpp
# Opt level: O3

void __thiscall
Valid_case_test_Sort_Sort_unit_test_Test::TestBody(Valid_case_test_Sort_Sort_unit_test_Test *this)

{
  int *piVar1;
  ulong uVar2;
  bool bVar3;
  int i;
  uint uVar4;
  int *a;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  char *pcVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int j;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  int local_4c;
  AssertHelper local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  a = (int *)operator_new__(20000);
  iVar14 = 0;
  iVar15 = 1;
  iVar16 = 2;
  iVar17 = 3;
  lVar5 = 0;
  do {
    piVar1 = a + lVar5;
    *piVar1 = iVar14;
    piVar1[1] = iVar15;
    piVar1[2] = iVar16;
    piVar1[3] = iVar17;
    lVar5 = lVar5 + 4;
    iVar14 = iVar14 + 4;
    iVar15 = iVar15 + 4;
    iVar16 = iVar16 + 4;
    iVar17 = iVar17 + 4;
  } while (lVar5 != 5000);
  uVar6 = 1;
  uVar7 = 0;
  do {
    uVar11 = uVar7 & 0xffffffff;
    uVar9 = uVar6;
    do {
      uVar2 = uVar9 & 0xffffffff;
      if (a[(int)uVar11] <= a[uVar9]) {
        uVar2 = uVar11;
      }
      uVar11 = uVar2;
      uVar9 = uVar9 + 1;
    } while (uVar9 != 5000);
    iVar14 = a[(int)uVar11];
    a[(int)uVar11] = a[uVar7];
    a[uVar7] = iVar14;
    uVar7 = uVar7 + 1;
    uVar6 = uVar6 + 1;
  } while (uVar7 != 4999);
  local_4c = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>(local_40,"j","a[j]",&local_4c,a + local_4c);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar13 = "";
      }
      else {
        pcVar13 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x19,pcVar13);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (((local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bVar3 = local_4c < 4999;
    local_4c = local_4c + 1;
  } while (bVar3);
  lVar5 = 0;
  do {
    iVar14 = a[lVar5];
    lVar10 = lVar5;
    if (lVar5 == 0) {
      lVar10 = 0;
    }
    else {
      do {
        if (a[lVar10 + -1] <= iVar14) goto LAB_0010bf03;
        a[lVar10] = a[lVar10 + -1];
        bVar3 = 1 < lVar10;
        lVar10 = lVar10 + -1;
      } while (bVar3);
      lVar10 = 0;
LAB_0010bf03:
      lVar10 = (long)(int)lVar10 << 2;
    }
    *(int *)((long)a + lVar10) = iVar14;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5000);
  local_4c = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>(local_40,"j","a[j]",&local_4c,a + local_4c);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar13 = "";
      }
      else {
        pcVar13 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x22,pcVar13);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (((local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bVar3 = local_4c < 4999;
    local_4c = local_4c + 1;
  } while (bVar3);
  uVar4 = 0x9c4;
  do {
    iVar14 = uVar4 * 2 + -2;
    iVar15 = uVar4 * 2 + -1;
    uVar8 = uVar4 - 1;
    do {
      if (iVar14 + 2 < iVar15) break;
      uVar7 = (long)iVar15;
      uVar6 = (ulong)uVar8;
      do {
        uVar9 = uVar7 & 0xffffffff;
        if (a[uVar7] <= a[(int)uVar6]) {
          uVar9 = uVar6;
        }
        uVar12 = (uint)uVar9;
      } while (((long)uVar7 < (long)(iVar14 + 2)) &&
              (bVar3 = (long)uVar7 < 4999, uVar7 = uVar7 + 1, uVar6 = uVar9, bVar3));
      if (uVar12 == uVar8) break;
      iVar14 = a[(int)uVar8];
      a[(int)uVar8] = a[(int)uVar12];
      a[(int)uVar12] = iVar14;
      iVar14 = uVar12 * 2;
      iVar15 = uVar12 * 2 + 1;
      uVar8 = uVar12;
    } while (iVar15 < 5000);
    bVar3 = 1 < uVar4;
    uVar4 = uVar4 - 1;
  } while (bVar3);
  iVar14 = *a;
  *a = a[4999];
  a[4999] = iVar14;
  uVar7 = 4999;
  do {
    iVar14 = 0;
    iVar15 = 1;
    uVar4 = 0;
    do {
      if (iVar14 + 2 < iVar15) break;
      uVar9 = (ulong)iVar15;
      uVar6 = (ulong)uVar4;
      do {
        uVar11 = uVar9 & 0xffffffff;
        if (a[uVar9] <= a[(int)uVar6]) {
          uVar11 = uVar6;
        }
        uVar8 = (uint)uVar11;
      } while (((long)uVar9 < (long)(iVar14 + 2)) &&
              (uVar9 = uVar9 + 1, uVar6 = uVar11, (long)uVar9 < (long)uVar7));
      if (uVar8 == uVar4) break;
      iVar14 = a[(int)uVar4];
      a[(int)uVar4] = a[(int)uVar8];
      a[(int)uVar8] = iVar14;
      iVar14 = uVar8 * 2;
      iVar15 = uVar8 * 2 + 1;
      uVar4 = uVar8;
    } while ((long)iVar15 < (long)uVar7);
    iVar14 = *a;
    *a = a[uVar7 - 1];
    a[uVar7 - 1] = iVar14;
    uVar7 = uVar7 - 1;
  } while (1 < uVar7);
  local_4c = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>(local_40,"j","a[j]",&local_4c,a + local_4c);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar13 = "";
      }
      else {
        pcVar13 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x27,pcVar13);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (((local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar14 = local_4c + 1;
    bVar3 = local_4c < 4999;
    local_4c = iVar14;
  } while (bVar3);
  QuickSort<int>(a,0,4999,Less<int>);
  local_4c = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>(local_40,"j","a[j]",&local_4c,a + local_4c);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar13 = "";
      }
      else {
        pcVar13 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x2c,pcVar13);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (((local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar14 = local_4c + 1;
    bVar3 = local_4c < 4999;
    local_4c = iVar14;
  } while (bVar3);
  temp = (int *)operator_new__(20000);
  Merge_Sort<int>(a,0,4999,Less<int>);
  if (temp != (int *)0x0) {
    operator_delete__(temp);
  }
  local_4c = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>(local_40,"j","a[j]",&local_4c,a + local_4c);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar13 = "";
      }
      else {
        pcVar13 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x31,pcVar13);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (((local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bVar3 = local_4c < 4999;
    local_4c = local_4c + 1;
  } while (bVar3);
  uVar6 = 1;
  uVar7 = 0;
  do {
    uVar11 = uVar7 & 0xffffffff;
    uVar9 = uVar6;
    do {
      if (a[(int)uVar11] <= a[uVar9]) {
        uVar11 = uVar9 & 0xffffffff;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 5000);
    iVar14 = a[(int)uVar11];
    a[(int)uVar11] = a[uVar7];
    a[uVar7] = iVar14;
    uVar7 = uVar7 + 1;
    uVar6 = uVar6 + 1;
  } while (uVar7 != 4999);
  local_4c = 4999;
  lVar5 = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>(local_40,"j","a[i]",&local_4c,(int *)((long)a + lVar5));
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar13 = "";
      }
      else {
        pcVar13 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x3c,pcVar13);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (((local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_4c = local_4c + -1;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 20000);
  lVar5 = 0;
  do {
    iVar14 = a[lVar5];
    lVar10 = lVar5;
    if (lVar5 == 0) {
      lVar10 = 0;
    }
    else {
      do {
        if (iVar14 < a[lVar10 + -1]) goto LAB_0010c2f0;
        a[lVar10] = a[lVar10 + -1];
        bVar3 = 1 < lVar10;
        lVar10 = lVar10 + -1;
      } while (bVar3);
      lVar10 = 0;
LAB_0010c2f0:
      lVar10 = (long)(int)lVar10 << 2;
    }
    *(int *)((long)a + lVar10) = iVar14;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5000);
  local_4c = 4999;
  lVar5 = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>(local_40,"j","a[i]",&local_4c,(int *)((long)a + lVar5));
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar13 = "";
      }
      else {
        pcVar13 = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                 ,0x45,pcVar13);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (((local_58.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_4c = local_4c + -1;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 20000);
  uVar4 = 0x9c4;
  do {
    iVar14 = uVar4 * 2 + -2;
    iVar15 = uVar4 * 2 + -1;
    uVar8 = uVar4 - 1;
    do {
      if (iVar14 + 2 < iVar15) break;
      uVar6 = (ulong)uVar8;
      uVar7 = (long)iVar15;
      do {
        if (a[uVar7] <= a[(int)uVar6]) {
          uVar6 = uVar7 & 0xffffffff;
        }
      } while (((long)uVar7 < (long)(iVar14 + 2)) &&
              (bVar3 = (long)uVar7 < 4999, uVar7 = uVar7 + 1, bVar3));
      uVar12 = (uint)uVar6;
      if (uVar12 == uVar8) break;
      iVar14 = a[(int)uVar8];
      a[(int)uVar8] = a[(int)uVar12];
      a[(int)uVar12] = iVar14;
      iVar14 = uVar12 * 2;
      iVar15 = uVar12 * 2 + 1;
      uVar8 = uVar12;
    } while (iVar15 < 5000);
    bVar3 = 1 < uVar4;
    uVar4 = uVar4 - 1;
  } while (bVar3);
  iVar14 = *a;
  *a = a[4999];
  a[4999] = iVar14;
  uVar7 = 4999;
  do {
    iVar14 = 0;
    iVar15 = 1;
    uVar4 = 0;
    do {
      if (iVar14 + 2 < iVar15) break;
      uVar9 = (ulong)iVar15;
      uVar6 = (ulong)uVar4;
      do {
        if (a[uVar9] <= a[(int)uVar6]) {
          uVar6 = uVar9 & 0xffffffff;
        }
      } while (((long)uVar9 < (long)(iVar14 + 2)) && (uVar9 = uVar9 + 1, (long)uVar9 < (long)uVar7))
      ;
      uVar8 = (uint)uVar6;
      if (uVar8 == uVar4) break;
      iVar14 = a[(int)uVar4];
      a[(int)uVar4] = a[(int)uVar8];
      a[(int)uVar8] = iVar14;
      iVar14 = uVar8 * 2;
      iVar15 = uVar8 * 2 + 1;
      uVar4 = uVar8;
    } while ((long)iVar15 < (long)uVar7);
    iVar14 = *a;
    *a = a[uVar7 - 1];
    a[uVar7 - 1] = iVar14;
    uVar7 = uVar7 - 1;
    if (uVar7 < 2) {
      local_4c = 4999;
      lVar5 = 0;
      do {
        testing::internal::CmpHelperEQ<int,int>
                  (local_40,"j","a[i]",&local_4c,(int *)((long)a + lVar5));
        if (local_40[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_58);
          if (local_38.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar13 = "";
          }
          else {
            pcVar13 = ((local_38.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                     ,0x4a,pcVar13);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (((local_58.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
              (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
             (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_58.ptr_ + 8))();
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          return;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_4c = local_4c + -1;
        lVar5 = lVar5 + 4;
      } while (lVar5 != 20000);
      lVar5 = 0;
      QuickSort<int>(a,0,4999,Greater<int>);
      local_4c = 4999;
      do {
        testing::internal::CmpHelperEQ<int,int>
                  (local_40,"j","a[i]",&local_4c,(int *)((long)a + lVar5));
        if (local_40[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_58);
          if (local_38.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar13 = "";
          }
          else {
            pcVar13 = ((local_38.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                     ,0x4f,pcVar13);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (((local_58.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
              (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
             (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_58.ptr_ + 8))();
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          return;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_4c = local_4c + -1;
        lVar5 = lVar5 + 4;
      } while (lVar5 != 20000);
      temp = (int *)operator_new__(20000);
      Merge_Sort<int>(a,0,4999,Greater<int>);
      if (temp != (int *)0x0) {
        operator_delete__(temp);
      }
      local_4c = 4999;
      lVar5 = 0;
      do {
        testing::internal::CmpHelperEQ<int,int>
                  (local_40,"j","a[i]",&local_4c,(int *)((long)a + lVar5));
        if (local_40[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_58);
          if (local_38.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar13 = "";
          }
          else {
            pcVar13 = ((local_38.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_48,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/Data Structures and Algorithms/Algorithms/Sorts/Sort_TEST.cpp"
                     ,0x54,pcVar13);
          testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_48);
          if (((local_58.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
              (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
             (local_58.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_58.ptr_ + 8))();
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          return;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_4c = local_4c + -1;
        lVar5 = lVar5 + 4;
      } while (lVar5 != 20000);
      operator_delete__(a);
      return;
    }
  } while( true );
}

Assistant:

TEST(Valid_case_test_Sort, Sort_unit_test){

    int n = 5000;
    int *a = new int[n];
    for (int i = 0; i < n; ++i) {
        a[i] = i;
    }

    /*
     * ALL SORT FOLLOW LESS
     */

    SelectionSort(a, n, Less);

    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    /*
     * 1 is h
     * h for shellSort, h can 1, 3, 5
     */
    InsertionSort(a, n, 1, Less);
    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    HeapSort(a, n, Less);
    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    QuickSort(a, 0, n - 1, Less);
    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    MergeSort(a, n, Less);
    for (int j = 0; j < n; ++j) {
        ASSERT_EQ(j, a[j]);
    }

    //---------------------------

    /*
     * ALL SORT FOLLOW GREATER
     */

    SelectionSort(a, n, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    /*
     * 1 is h
     * h for shellSort, h can 1, 3, 5
     */
    InsertionSort(a, n, 1, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    HeapSort(a, n, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    QuickSort(a, 0,  n - 1, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    MergeSort(a, n, Greater);
    for (int j = n - 1, i = 0; i < n; --j, i++) {
        ASSERT_EQ(j, a[i]);
    }

    delete []a;
}